

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int write_iff(lyout *out,lys_module *module,lys_iffeature *expr,int module_name_or_prefix,
             int *index_e,int *index_f)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  char *pcVar8;
  int local_40;
  int iStack_3c;
  uint8_t op;
  int brackets_flag;
  int count;
  int *index_f_local;
  int *index_e_local;
  int module_name_or_prefix_local;
  lys_iffeature *expr_local;
  lys_module *module_local;
  lyout *out_local;
  
  iStack_3c = 0;
  local_40 = *index_e;
  uVar1 = iff_getop(expr->expr,*index_e);
  *index_e = *index_e + 1;
  switch(uVar1) {
  case '\0':
    iVar3 = ly_print(out,"not ");
    iStack_3c = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
    iStack_3c = iStack_3c + iVar3;
    break;
  case '\x01':
    if ((local_40 != 0) &&
       ((*index_e < 2 || (uVar2 = iff_getop(expr->expr,*index_e + -2), uVar2 != '\0')))) {
      local_40 = 0;
    }
  case '\x02':
    if (local_40 != 0) {
      iStack_3c = ly_print(out,"(");
    }
    iVar3 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
    pcVar8 = "and";
    if (uVar1 == '\x02') {
      pcVar8 = "or";
    }
    iVar4 = ly_print(out," %s ",pcVar8);
    iVar5 = write_iff(out,module,expr,module_name_or_prefix,index_e,index_f);
    iStack_3c = iVar5 + iVar4 + iVar3 + iStack_3c;
    if (local_40 != 0) {
      iVar3 = ly_print(out,")");
      iStack_3c = iVar3 + iStack_3c;
    }
    break;
  case '\x03':
    plVar6 = lys_main_module(expr->features[*index_f]->module);
    plVar7 = lys_main_module(module);
    if (plVar6 != plVar7) {
      if (module_name_or_prefix == 0) {
        plVar6 = lys_main_module(expr->features[*index_f]->module);
        pcVar8 = transform_module_name2import_prefix(module,plVar6->name);
        iStack_3c = ly_print(out,"%s:",pcVar8);
      }
      else {
        plVar6 = lys_main_module(expr->features[*index_f]->module);
        iStack_3c = ly_print(out,"%s:",plVar6->name);
      }
    }
    iVar3 = ly_print(out,expr->features[*index_f]->name);
    iStack_3c = iVar3 + iStack_3c;
    *index_f = *index_f + 1;
  }
  return iStack_3c;
}

Assistant:

static int
write_iff(struct lyout *out, const struct lys_module *module, struct lys_iffeature *expr, int module_name_or_prefix,
          int *index_e, int *index_f)
{
    int count = 0, brackets_flag = *index_e;
    uint8_t op;

    op = iff_getop(expr->expr, *index_e);
    (*index_e)++;

    switch (op) {
    case LYS_IFF_F:
        if (lys_main_module(expr->features[*index_f]->module) != lys_main_module(module)) {
            if (module_name_or_prefix) {
                count += ly_print(out, "%s:", lys_main_module(expr->features[*index_f]->module)->name);
            } else {
                count += ly_print(out, "%s:", transform_module_name2import_prefix(module, lys_main_module(expr->features[*index_f]->module)->name));
            }
        }
        count += ly_print(out, expr->features[*index_f]->name);
        (*index_f)++;
        break;
    case LYS_IFF_NOT:
        count += ly_print(out, "not ");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        break;
    case LYS_IFF_AND:
        if (brackets_flag) {
            /* AND need brackets only if previous op was not */
            if (*index_e < 2 || iff_getop(expr->expr, *index_e - 2) != LYS_IFF_NOT) {
                brackets_flag = 0;
            }
        }
        /* no break */
    case LYS_IFF_OR:
        if (brackets_flag) {
            count += ly_print(out, "(");
        }
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        count += ly_print(out, " %s ", op == LYS_IFF_OR ? "or" : "and");
        count += write_iff(out, module, expr, module_name_or_prefix, index_e, index_f);
        if (brackets_flag) {
            count += ly_print(out, ")");
        }
    }

    return count;
}